

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_SetMergeOrder(Kf_Set_t *p,int *pCuts0,int *pCuts1,int fArea,int fCutMin)

{
  int iVar1;
  Kf_Cut_t *pCut;
  word wVar2;
  int nOldSupp;
  Kf_Cut_t *pCutR;
  Kf_Cut_t *pCut1;
  Kf_Cut_t *pCut0;
  int fCutMin_local;
  int fArea_local;
  int *pCuts1_local;
  int *pCuts0_local;
  Kf_Set_t *p_local;
  
  Kf_SetPrepare(p,pCuts0,pCuts1);
  p->CutCount[0] = (long)(p->nCuts0 * p->nCuts1) + p->CutCount[0];
  pCut1 = p->pCuts0;
  do {
    if (p->pCuts0 + p->nCuts0 <= pCut1) {
      Kf_SetFilterOrder(p);
      iVar1 = Abc_MinInt(p->nCuts,p->nCutNum - 1);
      p->CutCount[3] = (long)iVar1 + p->CutCount[3];
      Kf_SetSelectBest(p,fArea,1);
      return;
    }
    for (pCutR = p->pCuts1; pCutR < p->pCuts1 + p->nCuts1; pCutR = pCutR + 1) {
      if ((pCut1->nLeaves + pCutR->nLeaves <= (int)(uint)p->nLutSize) ||
         (iVar1 = Kf_SetCountBits(pCut1->Sign | pCutR->Sign), iVar1 <= (int)(uint)p->nLutSize)) {
        p->CutCount[1] = p->CutCount[1] + 1;
        pCut = p->pCutsR + p->nCuts;
        iVar1 = Kf_SetMergeOrderOne(pCut1,pCutR,pCut,(uint)p->nLutSize);
        if (iVar1 != 0) {
          p->CutCount[2] = p->CutCount[2] + 1;
          pCut->Sign = pCut1->Sign | pCutR->Sign;
          iVar1 = Kf_SetRemoveDuplicatesOrder(p,pCut);
          if (iVar1 == 0) {
            p->nCuts = p->nCuts + 1;
            if (fCutMin != 0) {
              if (pCut->nLeaves < pCut->nLeaves) {
                __assert_fail("pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                              ,0x32b,"void Kf_SetMergeOrder(Kf_Set_t *, int *, int *, int, int)");
              }
              if (pCut->nLeaves < pCut->nLeaves) {
                wVar2 = Kf_SetCutGetSign(pCut);
                pCut->Sign = wVar2;
              }
            }
            if (pCut->nLeaves < 2) {
              __assert_fail("pCutR->nLeaves > 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                            ,0x330,"void Kf_SetMergeOrder(Kf_Set_t *, int *, int *, int, int)");
            }
            iVar1 = Abc_MaxInt(pCut1->Delay,pCutR->Delay);
            pCut->Delay = iVar1;
            pCut->Area = pCut1->Area + pCutR->Area;
            Kf_SetAddToList(p,pCut,0);
          }
        }
      }
    }
    pCut1 = pCut1 + 1;
  } while( true );
}

Assistant:

static inline void Kf_SetMergeOrder( Kf_Set_t * p, int * pCuts0, int * pCuts1, int fArea, int fCutMin )
{
    Kf_Cut_t * pCut0, * pCut1, * pCutR;
    Kf_SetPrepare( p, pCuts0, pCuts1 );
    p->CutCount[0] += p->nCuts0 * p->nCuts1;
    for ( pCut0 = p->pCuts0; pCut0 < p->pCuts0 + p->nCuts0; pCut0++ )
    for ( pCut1 = p->pCuts1; pCut1 < p->pCuts1 + p->nCuts1; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        p->CutCount[1]++;        
        pCutR = p->pCutsR + p->nCuts;
        if ( !Kf_SetMergeOrderOne(pCut0, pCut1, pCutR, p->nLutSize) )
            continue;
        p->CutCount[2]++;        
        pCutR->Sign = pCut0->Sign | pCut1->Sign;
        if ( Kf_SetRemoveDuplicatesOrder(p, pCutR) )
            continue;
        p->nCuts++;
        if ( fCutMin )
        {
            int nOldSupp = pCutR->nLeaves;
//            pCutR->iFunc = Kf_SetComputeTruth( p, pCut0->iFunc, pCut1->iFunc, pCut0, pCut1, pCutR );
            assert( pCutR->nLeaves <= nOldSupp );
            if ( pCutR->nLeaves < nOldSupp )
                pCutR->Sign = Kf_SetCutGetSign( pCutR );
            // delay and area are inaccurate
        }
        assert( pCutR->nLeaves > 1 );
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_SetFilterOrder( p );
//    Kf_CheckCuts( p );
    p->CutCount[3] += Abc_MinInt( p->nCuts, p->nCutNum-1 );
    Kf_SetSelectBest( p, fArea, 1 );
}